

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::IGXMLScanner::scanStartTag(IGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  uint uVar1;
  Grammar *pGVar2;
  XMLValidator *pXVar3;
  XMLDocumentHandler *pXVar4;
  XMLBuffer *pXVar5;
  bool bVar6;
  byte bVar7;
  XMLCh XVar8;
  int iVar9;
  undefined4 extraout_var;
  DTDElementDecl *this_01;
  XMLSize_t XVar10;
  DTDAttDef *attDef;
  XMLAttr *pXVar11;
  uint *puVar12;
  XMLCh *pXVar13;
  MemoryManager *pMVar14;
  long *plVar15;
  ulong uVar16;
  long *key;
  undefined4 extraout_var_02;
  XMLCh *pXVar17;
  UnexpectedEOFException *this_02;
  XMLByte *pXVar18;
  AttTypes AVar19;
  MemoryManager *pMVar20;
  ulong uVar21;
  ulong uVar22;
  bool bFoundSpace;
  MemoryManager *local_78;
  ulong local_70;
  XMLBuffer *local_68;
  XMLSize_t local_60;
  XMLSize_t local_58;
  ElemStack *local_50;
  XMLAttr *local_48;
  bool *local_40;
  XMLSize_t failure;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_40 = gotData;
  bVar6 = ReaderMgr::getName(this_00,&(this->super_XMLScanner).fQNameBuf);
  if (!bVar6) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    ReaderMgr::skipToChar(this_00,L'<');
    return false;
  }
  pXVar17 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar17[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar2 = (this->super_XMLScanner).fGrammar;
  iVar9 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar2,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_01 = (DTDElementDecl *)CONCAT44(extraout_var,iVar9);
  if ((this_01 == (DTDElementDecl *)0x0) &&
     (this_01 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this->fDTDElemNonDeclPool,pXVar17)
     , this_01 == (DTDElementDecl *)0x0)) {
    this_01 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_01,pXVar17,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar10 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_01);
    (this_01->super_XMLElementDecl).fId = XVar10;
    if ((this->super_XMLScanner).fValidate != true) goto LAB_002a7957;
    (this_01->super_XMLElementDecl).fCreateReason = JustFaultIn;
  }
  else if (((this->super_XMLScanner).fValidate != true) ||
          ((this_01->super_XMLElementDecl).fCreateReason == Declared)) goto LAB_002a7957;
  pXVar3 = (this->super_XMLScanner).fValidator;
  pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
  XMLValidator::emitError(pXVar3,ElementNotDefined,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
LAB_002a7957:
  local_50 = &(this->super_XMLScanner).fElemStack;
  local_60 = (this->super_XMLScanner).fElemStack.fStackTop;
  ElemStack::addLevel(local_50,&this_01->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  bVar6 = (this->super_XMLScanner).fValidate;
  (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]->
  fValidationFlag = bVar6;
  if (bVar6 == true) {
    pXVar3 = (this->super_XMLScanner).fValidator;
    (*pXVar3->_vptr_XMLValidator[9])(pXVar3,this_01);
  }
  if (local_60 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar17 = (this->super_XMLScanner).fRootElemName, pXVar17 != (XMLCh *)0x0)) {
      pXVar13 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar13[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
      bVar6 = XMLString::equals(pXVar13,pXVar17);
      if (!bVar6) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
      }
    }
  }
  else {
    ElemStack::addChild(local_50,(this_01->super_XMLElementDecl).fElementName,true);
  }
  ReaderMgr::skipPastSpaces(this_00);
  local_58 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
             fCurCount;
  this->fElemCount = this->fElemCount + 1;
  local_68 = &(this->super_XMLScanner).fAttValueBuf;
  uVar21 = 0;
LAB_002a7a51:
  while( true ) {
    XVar8 = ReaderMgr::peekNextChar(this_00);
    if (((uVar21 != 0) && (XVar8 != L'/')) && (XVar8 != L'>')) {
      ReaderMgr::skipPastSpaces(this_00,&bFoundSpace,false);
      if (bFoundSpace == false) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
      XVar8 = ReaderMgr::peekNextChar(this_00);
    }
    pXVar18 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
    if ((pXVar18[(ushort)XVar8] & 0x10) == 0) break;
    if ((XVar8 == L'\"') || (XVar8 == L'\'')) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      ReaderMgr::getNextChar(this_00);
      ReaderMgr::skipQuotedString(this_00,XVar8);
      ReaderMgr::skipPastSpaces(this_00);
    }
    else {
      if (XVar8 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar6 = ReaderMgr::skippedChar(this_00,L'>');
        local_78 = (MemoryManager *)CONCAT71((int7)((ulong)pXVar18 >> 8),1);
        if (!bVar6) {
          pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          goto LAB_002a7ebd;
        }
LAB_002a7ed5:
        if (uVar21 != 0) {
          Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
        }
        iVar9 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])
                          (this_01);
        if ((char)iVar9 == '\0') goto LAB_002a80ea;
        local_70 = uVar21;
        iVar9 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])
                          (this_01);
        plVar15 = (long *)CONCAT44(extraout_var_01,iVar9);
        uVar22 = 0;
        goto LAB_002a7f0f;
      }
      if (XVar8 == L'<') {
        pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        local_78 = (MemoryManager *)0x0;
LAB_002a7ebd:
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        goto LAB_002a7ed5;
      }
      if (XVar8 == L'>') {
        ReaderMgr::getNextChar(this_00);
        local_78 = (MemoryManager *)0x0;
        goto LAB_002a7ed5;
      }
      if (XVar8 == L'\0') {
        this_02 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (this_02,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                   ,0x77c,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(this_02,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
    }
  }
  bVar6 = ReaderMgr::getName(this_00,&(this->super_XMLScanner).fAttNameBuf);
  if (!bVar6) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
    ReaderMgr::skipPastChar(this_00,L'>');
    return false;
  }
  bVar6 = XMLScanner::scanEq(&this->super_XMLScanner,false);
  if (!bVar6) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
    XVar8 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
    if ((XVar8 == L'/') || (XVar8 == L'>')) goto LAB_002a7a51;
    if ((XVar8 != L'\"') &&
       ((XVar8 != L'\'' &&
        (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                    [(ushort)XVar8])))) goto joined_r0x002a81e5;
  }
  pXVar17 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
  pXVar17[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
  attDef = DTDElementDecl::getAttDef(this_01,pXVar17);
  if (uVar21 < local_58) {
    local_70 = uVar21;
    pXVar11 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,uVar21);
    if (attDef == (DTDAttDef *)0x0) {
      AVar19 = AttTypes_Min;
    }
    else {
      AVar19 = (attDef->super_XMLAttDef).fType;
    }
    XMLAttr::set(pXVar11,0,pXVar17,L"",L"",AVar19,(DatatypeValidator *)0x0,false);
    pXVar11->fSpecified = true;
  }
  else {
    local_78 = (this->super_XMLScanner).fMemoryManager;
    local_70 = uVar21;
    pXVar11 = (XMLAttr *)XMemory::operator_new(0x28,local_78);
    if (attDef == (DTDAttDef *)0x0) {
      AVar19 = AttTypes_Min;
    }
    else {
      AVar19 = (attDef->super_XMLAttDef).fType;
    }
    XMLAttr::XMLAttr(pXVar11,0,pXVar17,L"",L"",AVar19,true,(this->super_XMLScanner).fMemoryManager,
                     (DatatypeValidator *)0x0,false);
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
              (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
               pXVar11);
  }
  pMVar20 = (MemoryManager *)pXVar11->fAttName->fLocalPart;
  pMVar14 = pMVar20;
  if (attDef == (DTDAttDef *)0x0) {
    if ((this->super_XMLScanner).fValidate == true) {
      pXVar17 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar3 = (this->super_XMLScanner).fValidator;
      pXVar17[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
      local_78 = pMVar20;
      local_48 = pXVar11;
      pXVar13 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
      pXVar11 = local_48;
      pMVar14 = local_78;
      XMLValidator::emitError
                (pXVar3,AttNotDefinedForElement,pXVar17,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    bVar6 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                      (this->fUndeclaredAttrRegistry,pMVar14,0);
    if (!bVar6) {
      pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
      pMVar20 = pMVar14;
LAB_002a7d77:
      XMLScanner::emitError
                (&this->super_XMLScanner,AttrAlreadyUsedInSTag,(XMLCh *)pMVar14,pXVar17,(XMLCh *)0x0
                 ,(XMLCh *)0x0);
      pMVar14 = pMVar20;
    }
  }
  else {
    puVar12 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                        (this->fAttDefRegistry,attDef);
    if (puVar12 == (uint *)0x0) {
      puVar12 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
      *puVar12 = this->fElemCount;
      RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                (this->fAttDefRegistry,attDef,puVar12);
    }
    else {
      if (this->fElemCount <= *puVar12) {
        iVar9 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
        pMVar14 = (MemoryManager *)CONCAT44(extraout_var_00,iVar9);
        local_78 = pMVar20;
        pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        pMVar20 = local_78;
        goto LAB_002a7d77;
      }
      *puVar12 = this->fElemCount;
    }
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar6 = scanAttValue(this,&attDef->super_XMLAttDef,(XMLCh *)pMVar14,local_68);
  if (!bVar6) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
    XVar8 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
    if (((XVar8 != L'/') && (XVar8 != L'>')) &&
       (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar8]
       )) {
joined_r0x002a81e5:
      if (XVar8 != L'<') {
        return false;
      }
      pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return false;
    }
  }
  pXVar17 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
  pXVar17[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
  XMLAttr::setValue(pXVar11,pXVar17);
  if ((attDef != (DTDAttDef *)0x0) && ((this->super_XMLScanner).fValidate == true)) {
    pXVar17 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
    pXVar3 = (this->super_XMLScanner).fValidator;
    pXVar17[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
    (*pXVar3->_vptr_XMLValidator[8])(pXVar3,attDef,pXVar17,0);
  }
  uVar21 = local_70 + 1;
  goto LAB_002a7a51;
LAB_002a7f0f:
  uVar16 = (**(code **)(*plVar15 + 0x50))(plVar15);
  uVar21 = local_70;
  if (uVar16 <= uVar22) {
LAB_002a80ea:
    if ((char)local_78 != '\0') {
      if (((this->super_XMLScanner).fValidate == true) &&
         (pXVar3 = (this->super_XMLScanner).fValidator,
         iVar9 = (*pXVar3->_vptr_XMLValidator[2])(pXVar3,this_01,0,0), (char)iVar9 == '\0')) {
        pXVar3 = (this->super_XMLScanner).fValidator;
        pXVar17 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        iVar9 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                          (this_01);
        XMLValidator::emitError
                  (pXVar3,ElementNotValidForContent,pXVar17,(XMLCh *)CONCAT44(extraout_var_02,iVar9)
                   ,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      ElemStack::popTop(local_50);
      if (local_60 == 0) {
        *local_40 = false;
      }
      else {
        (this->super_XMLScanner).fValidate =
             (this->super_XMLScanner).fElemStack.fStack
             [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag;
      }
    }
    pXVar4 = (this->super_XMLScanner).fDocHandler;
    if (pXVar4 != (XMLDocumentHandler *)0x0) {
      (*pXVar4->_vptr_XMLDocumentHandler[0xb])
                (pXVar4,this_01,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                 (this->super_XMLScanner).fAttrList,uVar21,(ulong)local_78 & 0xff,
                 (ulong)(local_60 == 0));
    }
    return true;
  }
  key = (long *)(**(code **)(*plVar15 + 0x58))(plVar15,uVar22);
  uVar1 = *(uint *)(key + 1);
  puVar12 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get(this->fAttDefRegistry,key);
  if ((puVar12 == (uint *)0x0) || (*puVar12 < this->fElemCount)) {
    bVar7 = (this->super_XMLScanner).fValidate;
    if ((bool)bVar7 == true) {
      if (uVar1 == 2) {
        pXVar3 = (this->super_XMLScanner).fValidator;
        pXVar17 = (XMLCh *)(**(code **)(*key + 0x28))(key);
        XMLValidator::emitError
                  (pXVar3,RequiredAttrNotProvided,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if (uVar1 < 2) {
        if (((this->super_XMLScanner).fStandalone == true) &&
           (*(char *)((long)key + 0x14) == '\x01')) {
          pXVar3 = (this->super_XMLScanner).fValidator;
          pXVar17 = (XMLCh *)(**(code **)(*key + 0x28))(key);
          pXVar13 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          XMLValidator::emitError
                    (pXVar3,NoDefAttForStandalone,pXVar17,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0);
          bVar7 = (this->super_XMLScanner).fValidate;
        }
        goto LAB_002a7f9d;
      }
    }
    else if (uVar1 < 2) {
LAB_002a7f9d:
      if ((bVar7 & 1) != 0) {
        pXVar3 = (this->super_XMLScanner).fValidator;
        (*pXVar3->_vptr_XMLValidator[8])(pXVar3,key,key[4],0,this_01);
      }
      uVar21 = local_70;
      if (local_70 < local_58) {
        local_68 = (XMLBuffer *)
                   BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                             (&((this->super_XMLScanner).fAttrList)->
                               super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_70);
        pXVar17 = (XMLCh *)(**(code **)(*key + 0x28))(key);
        pXVar5 = local_68;
        XMLAttr::set((XMLAttr *)local_68,0,pXVar17,L"",(XMLCh *)key[4],
                     *(AttTypes *)((long)key + 0xc),(DatatypeValidator *)0x0,false);
        *(undefined1 *)&pXVar5->fIndex = 0;
        local_70 = uVar21;
      }
      else {
        pXVar11 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
        pXVar17 = (XMLCh *)(**(code **)(*key + 0x28))(key);
        XMLAttr::XMLAttr(pXVar11,0,pXVar17,L"",(XMLCh *)key[4],*(AttTypes *)((long)key + 0xc),false,
                         (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,false);
        BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                  (&((this->super_XMLScanner).fAttrList)->
                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,pXVar11);
        local_58 = local_58 + 1;
      }
      local_70 = local_70 + 1;
    }
  }
  uVar22 = uVar22 + 1;
  goto LAB_002a7f0f;
}

Assistant:

bool IGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We tell him to fault in a decl if he does not find one.
    //  Actually, we *don't* tell him to fault in a decl if he does not find one- NG
    bool wasAdded = false;
    const XMLCh *rawQName = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , rawQName
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look for it in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(rawQName);
    }
    if(!elemDecl)
    {
        // we're assuming this must be a DTD element.  DTD's can be
        // used with or without namespaces, but schemas cannot be used without
        // namespaces.
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            rawQName
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    //  We do something different here according to whether we found the
    //  element or not.
    if (wasAdded)
    {
        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }
    else
    {
        // If its not marked declared and validating, then emit an error
        if (fValidate && !elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setValidationFlag(fValidate);

    //  Validate the element
    if (fValidate)
        fValidator->validateElement(elemDecl);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(fQNameBuf.getRawBuffer(), fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );
                curAtt->setSpecified(true);
            }
            // reset namePtr so it refers to newly-allocated memory
            namePtr = (XMLCh *)curAtt->getName();

            if (!attDef)
            {
                //  If there is a validation handler, then we are validating
                //  so emit an error.
                if (fValidate)
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer()
                        , elemDecl->getFullName()
                    );
                }
                if(!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , namePtr
                        , elemDecl->getFullName()
                     );
                }
            }
            else
            {
                // prepare for duplicate detection
                unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                if(!curCountPtr)
                {
                    curCountPtr = getNewUIntPtr();
                    *curCountPtr = fElemCount;
                    fAttDefRegistry->put(attDef, curCountPtr);
                }
                else if(*curCountPtr < fElemCount)
                    *curCountPtr = fElemCount;
                else
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , attDef->getFullName()
                        , elemDecl->getFullName()
                    );
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(fAttValueBuf.getRawBuffer());

            //  Now that its all stretched out, lets look at its type and
            //  determine if it has a valid value. It will output any needed
            //  errors, but we just keep going. We only need to do this if
            //  we are validating.
            if (attDef)
            {
                // Let the validator pass judgement on the attribute value
                if (fValidate)
                {
                    fValidator->validateAttrValue
                    (
                        attDef
                        , fAttValueBuf.getRawBuffer()
                        , false
                        , elemDecl
                    );
                }
            }

            attCount++;
            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (elemDecl->hasAttDefs())
    {
        // N.B.:  this assumes DTD validation.
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            const XMLAttDef& curDef = attDefList.getAttDef(i);
            const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());

                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (attCount >= curAttListSize)
                    {
                        curAtt = new (fMemoryManager) XMLAttr
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                            , false
                            , fMemoryManager
                        );
                        fAttrList->addElement(curAtt);
                        curAttListSize++;
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(attCount);
                        curAtt->set
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                        );
                        curAtt->setSpecified(false);
                    }
                    attCount++;
                }
            }
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
        else {
            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}